

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affinespace.h
# Opt level: O1

void __thiscall
embree::SceneGraph::PerspectiveCameraData::PerspectiveCameraData
          (PerspectiveCameraData *this,PerspectiveCameraData *other,AffineSpace3fa *space)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar1 = (other->from).field_0.m128[0];
  fVar2 = (other->from).field_0.m128[1];
  fVar3 = (other->from).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->p).field_0.m128[1];
  fVar8 = (space->p).field_0.m128[2];
  fVar9 = (space->p).field_0.m128[3];
  fVar10 = (space->l).vy.field_0.m128[1];
  fVar11 = (space->l).vy.field_0.m128[2];
  fVar12 = (space->l).vy.field_0.m128[3];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  (this->from).field_0.m128[0] =
       fVar1 * (space->l).vx.field_0.m128[0] +
       fVar2 * (space->l).vy.field_0.m128[0] +
       fVar3 * (space->l).vz.field_0.m128[0] + (space->p).field_0.m128[0];
  (this->from).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar10 + fVar3 * fVar4 + fVar7;
  (this->from).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar11 + fVar3 * fVar5 + fVar8;
  (this->from).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar12 + fVar3 * fVar6 + fVar9;
  fVar1 = (other->to).field_0.m128[0];
  fVar2 = (other->to).field_0.m128[1];
  fVar3 = (other->to).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->p).field_0.m128[1];
  fVar8 = (space->p).field_0.m128[2];
  fVar9 = (space->p).field_0.m128[3];
  fVar10 = (space->l).vy.field_0.m128[1];
  fVar11 = (space->l).vy.field_0.m128[2];
  fVar12 = (space->l).vy.field_0.m128[3];
  fVar13 = (space->l).vx.field_0.m128[1];
  fVar14 = (space->l).vx.field_0.m128[2];
  fVar15 = (space->l).vx.field_0.m128[3];
  (this->to).field_0.m128[0] =
       fVar1 * (space->l).vx.field_0.m128[0] +
       fVar2 * (space->l).vy.field_0.m128[0] +
       fVar3 * (space->l).vz.field_0.m128[0] + (space->p).field_0.m128[0];
  (this->to).field_0.m128[1] = fVar1 * fVar13 + fVar2 * fVar10 + fVar3 * fVar4 + fVar7;
  (this->to).field_0.m128[2] = fVar1 * fVar14 + fVar2 * fVar11 + fVar3 * fVar5 + fVar8;
  (this->to).field_0.m128[3] = fVar1 * fVar15 + fVar2 * fVar12 + fVar3 * fVar6 + fVar9;
  fVar2 = (other->up).field_0.m128[0];
  fVar3 = (other->up).field_0.m128[1];
  fVar1 = (other->up).field_0.m128[2];
  fVar4 = (space->l).vz.field_0.m128[1];
  fVar5 = (space->l).vz.field_0.m128[2];
  fVar6 = (space->l).vz.field_0.m128[3];
  fVar7 = (space->l).vy.field_0.m128[1];
  fVar8 = (space->l).vy.field_0.m128[2];
  fVar9 = (space->l).vy.field_0.m128[3];
  fVar10 = (space->l).vx.field_0.m128[1];
  fVar11 = (space->l).vx.field_0.m128[2];
  fVar12 = (space->l).vx.field_0.m128[3];
  (this->up).field_0.m128[0] =
       fVar2 * (space->l).vx.field_0.m128[0] +
       fVar3 * (space->l).vy.field_0.m128[0] + fVar1 * (space->l).vz.field_0.m128[0];
  (this->up).field_0.m128[1] = fVar2 * fVar10 + fVar3 * fVar7 + fVar1 * fVar4;
  (this->up).field_0.m128[2] = fVar2 * fVar11 + fVar3 * fVar8 + fVar1 * fVar5;
  (this->up).field_0.m128[3] = fVar2 * fVar12 + fVar3 * fVar9 + fVar1 * fVar6;
  this->fov = other->fov;
  return;
}

Assistant:

__forceinline VectorT xfmPoint (const AffineSpaceT<L>& m, const VectorT& p) { return madd(VectorT(p.x),m.l.vx,madd(VectorT(p.y),m.l.vy,madd(VectorT(p.z),m.l.vz,m.p))); }